

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# compiler.c++
# Opt level: O1

void __thiscall
capnp::compiler::Compiler::Node::traverseBrand
          (Node *this,Reader *brand,uint eagerness,
          unordered_map<capnp::compiler::Compiler::Node_*,_unsigned_int,_std::hash<capnp::compiler::Compiler::Node_*>,_std::equal_to<capnp::compiler::Compiler::Node_*>,_std::allocator<std::pair<capnp::compiler::Compiler::Node_*const,_unsigned_int>_>_>
          *seen,SchemaLoader *finalLoader,
          Vector<capnp::schema::Node::SourceInfo::Reader> *sourceInfo)

{
  ListElementCount LVar1;
  ElementCount index;
  ElementCount index_00;
  Reader binding;
  Reader scope;
  StructReader local_140;
  StructReader local_110;
  PointerReader local_e0;
  ListReader local_c0;
  ListReader local_90;
  StructReader local_60;
  
  if ((brand->_reader).pointerCount == 0) {
    local_110.pointers._0_4_ = 0x7fffffff;
    local_110.capTable = (CapTableReader *)0x0;
    local_110.data = (WirePointer *)0x0;
    local_110.segment = (SegmentReader *)0x0;
  }
  else {
    local_110.segment = (brand->_reader).segment;
    local_110.capTable = (brand->_reader).capTable;
    local_110.data = (brand->_reader).pointers;
    local_110.pointers._0_4_ = (brand->_reader).nestingLimit;
  }
  index_00 = 0;
  capnp::_::PointerReader::getList
            (&local_90,(PointerReader *)&local_110,INLINE_COMPOSITE,(word *)0x0);
  if (local_90.elementCount != 0) {
    do {
      capnp::_::ListReader::getStructElement(&local_110,&local_90,index_00);
      if ((local_110.dataSize < 0x50) ||
         ((short)(((WirePointer *)((long)local_110.data + 8))->offsetAndKind).value == 0)) {
        if (local_110.pointerCount == 0) {
          local_140.pointers._0_4_ = 0x7fffffff;
          local_140.capTable = (CapTableReader *)0x0;
          local_140.data = (short *)0x0;
          local_140.segment = (SegmentReader *)0x0;
        }
        else {
          local_140.data = (void *)CONCAT44(local_110.pointers._4_4_,(int)local_110.pointers);
          local_140.capTable = local_110.capTable;
          local_140.segment = local_110.segment;
          local_140.pointers._0_4_ = local_110.nestingLimit;
        }
        capnp::_::PointerReader::getList
                  (&local_c0,(PointerReader *)&local_140,INLINE_COMPOSITE,(word *)0x0);
        LVar1 = local_c0.elementCount;
        if (local_c0.elementCount != 0) {
          index = 0;
          do {
            capnp::_::ListReader::getStructElement(&local_140,&local_c0,index);
            if ((0xf < local_140.dataSize) && (*local_140.data == 1)) {
              if (local_140.pointerCount == 0) {
                local_e0.nestingLimit = 0x7fffffff;
                local_e0.capTable = (CapTableReader *)0x0;
                local_e0.pointer = (WirePointer *)0x0;
                local_e0.segment = (SegmentReader *)0x0;
              }
              else {
                local_e0.pointer =
                     (WirePointer *)CONCAT44(local_140.pointers._4_4_,(int)local_140.pointers);
                local_e0.capTable = local_140.capTable;
                local_e0.segment = local_140.segment;
                local_e0.nestingLimit = local_140.nestingLimit;
              }
              capnp::_::PointerReader::getStruct(&local_60,&local_e0,(word *)0x0);
              traverseType(this,(Reader *)&local_60,eagerness,seen,finalLoader,sourceInfo);
            }
            index = index + 1;
          } while (LVar1 != index);
        }
      }
      index_00 = index_00 + 1;
    } while (index_00 != local_90.elementCount);
  }
  return;
}

Assistant:

void Compiler::Node::traverseBrand(
    const schema::Brand::Reader& brand, uint eagerness,
    std::unordered_map<Node*, uint>& seen,
    const SchemaLoader& finalLoader,
    kj::Vector<schema::Node::SourceInfo::Reader>& sourceInfo) {
  for (auto scope: brand.getScopes()) {
    switch (scope.which()) {
      case schema::Brand::Scope::BIND:
        for (auto binding: scope.getBind()) {
          switch (binding.which()) {
            case schema::Brand::Binding::UNBOUND:
              break;
            case schema::Brand::Binding::TYPE:
              traverseType(binding.getType(), eagerness, seen, finalLoader, sourceInfo);
              break;
          }
        }
        break;
      case schema::Brand::Scope::INHERIT:
        break;
    }
  }
}